

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::framebufferTexture2D
          (ReferenceContext *this,deUint32 target,deUint32 attachment,deUint32 textarget,
          deUint32 texture,int level)

{
  _Rb_tree_header *p_Var1;
  Framebuffer *pFVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  Attachment *pAVar6;
  long lVar7;
  TestError *this_00;
  Framebuffer *pFVar8;
  TexTarget TVar9;
  _Base_ptr p_Var10;
  int iVar11;
  _Base_ptr p_Var12;
  AttachmentType *attachment_00;
  int iVar13;
  bool bVar14;
  
  if ((int)attachment < 0x8d00) {
    if (attachment == 0x821a) {
      (*(this->super_Context)._vptr_Context[0x1e])
                (this,(ulong)target,0x8d00,(ulong)textarget,(ulong)texture,level);
      (*(this->super_Context)._vptr_Context[0x1e])
                (this,(ulong)target,0x8d20,(ulong)textarget,(ulong)texture,level);
      return;
    }
    if (attachment == 0x8ce0) {
      bVar14 = false;
      lVar7 = 0;
    }
    else {
LAB_00815ef7:
      lVar7 = 3;
      bVar14 = true;
    }
  }
  else {
    if (attachment == 0x8d00) {
      lVar7 = 1;
    }
    else {
      if (attachment != 0x8d20) goto LAB_00815ef7;
      lVar7 = 2;
    }
    bVar14 = false;
  }
  switch(textarget) {
  case 0x8515:
    bVar4 = 1;
    bVar3 = false;
    bVar5 = 1;
    TVar9 = TEXTARGET_CUBE_MAP_POSITIVE_X;
    goto LAB_00815fde;
  case 0x8516:
    TVar9 = TEXTARGET_CUBE_MAP_NEGATIVE_X;
    break;
  case 0x8517:
    TVar9 = TEXTARGET_CUBE_MAP_POSITIVE_Y;
    break;
  case 0x8518:
    TVar9 = TEXTARGET_CUBE_MAP_NEGATIVE_Y;
    break;
  case 0x8519:
    TVar9 = TEXTARGET_CUBE_MAP_POSITIVE_Z;
    break;
  case 0x851a:
    TVar9 = TEXTARGET_CUBE_MAP_NEGATIVE_Z;
    break;
  default:
    if (textarget == 0xde1) {
      bVar3 = true;
      bVar5 = 1;
      bVar4 = 0;
      TVar9 = TEXTARGET_2D;
    }
    else {
      TVar9 = TEXTARGET_LAST;
      bVar5 = 0;
      bVar4 = 1;
      bVar3 = false;
    }
    goto LAB_00815fde;
  }
  bVar4 = 1;
  bVar3 = false;
  bVar5 = 1;
LAB_00815fde:
  if (((1 < target - 0x8ca8) && (target != 0x8d40)) || (bVar14)) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  pFVar2 = this->m_drawFramebufferBinding;
  pFVar8 = this->m_readFramebufferBinding;
  if (target == 0x8ca9) {
    pFVar8 = pFVar2;
  }
  if (target == 0x8d40) {
    pFVar8 = pFVar2;
  }
  if (pFVar8 != (Framebuffer *)0x0) {
    if (texture == 0) {
      p_Var12 = (_Base_ptr)0x0;
      goto LAB_008160e2;
    }
    p_Var12 = (this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var12 != (_Base_ptr)0x0) {
      p_Var1 = &(this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = &p_Var1->_M_header;
      do {
        bVar14 = p_Var12[1]._M_color < texture;
        if (!bVar14) {
          p_Var10 = p_Var12;
        }
        p_Var12 = (&p_Var12->_M_left)[bVar14];
      } while (p_Var12 != (_Base_ptr)0x0);
      if ((((_Rb_tree_header *)p_Var10 != p_Var1) && (p_Var10[1]._M_color <= texture)) &&
         (p_Var12 = p_Var10[1]._M_parent, p_Var12 != (_Base_ptr)0x0)) {
        if (level != 0) {
          if (this->m_lastError != 0) {
            return;
          }
          this->m_lastError = 0x501;
          return;
        }
        if (*(int *)&p_Var12->_M_left == 2) {
          if ((bool)(bVar5 & bVar4)) goto LAB_008160e2;
        }
        else {
          if (*(int *)&p_Var12->_M_left != 1) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,(char *)0x0,"texObj->getType() == Texture::TYPE_CUBE_MAP",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                       ,0x7d7);
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          if (bVar3) {
LAB_008160e2:
            pAVar6 = pFVar8->m_attachments + lVar7;
            attachment_00 = &pAVar6->type;
            iVar11 = (uint)(pFVar8 == this->m_readFramebufferBinding) + (uint)(pFVar8 == pFVar2);
            for (iVar13 = iVar11; iVar13 != 0; iVar13 = iVar13 + -1) {
              releaseFboAttachmentReference(this,(Attachment *)attachment_00);
            }
            pAVar6->type = ATTACHMENTTYPE_LAST;
            pAVar6->name = 0;
            pFVar8->m_attachments[lVar7].texTarget = TEXTARGET_LAST;
            pFVar8->m_attachments[lVar7].level = 0;
            pFVar8->m_attachments[lVar7].layer = 0;
            if (p_Var12 == (_Base_ptr)0x0) {
              return;
            }
            *attachment_00 = ATTACHMENTTYPE_TEXTURE;
            pFVar8->m_attachments[lVar7].name = *(deUint32 *)&p_Var12->_M_parent;
            pFVar8->m_attachments[lVar7].texTarget = TVar9;
            pFVar8->m_attachments[lVar7].level = level;
            for (; iVar11 != 0; iVar11 = iVar11 + -1) {
              acquireFboAttachmentReference(this,(Attachment *)attachment_00);
            }
            return;
          }
        }
      }
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x502;
  }
  return;
}

Assistant:

void ReferenceContext::framebufferTexture2D (deUint32 target, deUint32 attachment, deUint32 textarget, deUint32 texture, int level)
{
	if (attachment == GL_DEPTH_STENCIL_ATTACHMENT)
	{
		// Attach to both depth and stencil.
		framebufferTexture2D(target, GL_DEPTH_ATTACHMENT,	textarget, texture, level);
		framebufferTexture2D(target, GL_STENCIL_ATTACHMENT,	textarget, texture, level);
	}
	else
	{
		Framebuffer::AttachmentPoint	point			= mapGLAttachmentPoint(attachment);
		Texture*						texObj			= DE_NULL;
		Framebuffer::TexTarget			fboTexTarget	= mapGLFboTexTarget(textarget);

		RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
					target != GL_DRAW_FRAMEBUFFER	&&
					target != GL_READ_FRAMEBUFFER,				GL_INVALID_ENUM,		RC_RET_VOID);
		RC_IF_ERROR(point == Framebuffer::ATTACHMENTPOINT_LAST,	GL_INVALID_ENUM,		RC_RET_VOID);

		// Select binding point.
		rc::Framebuffer* framebufferBinding = (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER) ? m_drawFramebufferBinding : m_readFramebufferBinding;
		RC_IF_ERROR(!framebufferBinding, GL_INVALID_OPERATION, RC_RET_VOID);

		// If framebuffer object is bound for both reading and writing then we need to acquire/release multiple references.
		int bindingRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
							+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

		if (texture != 0)
		{
			texObj = m_textures.find(texture);

			RC_IF_ERROR(!texObj,		GL_INVALID_OPERATION,	RC_RET_VOID);
			RC_IF_ERROR(level != 0,		GL_INVALID_VALUE,		RC_RET_VOID); // \todo [2012-03-19 pyry] We should allow other levels as well.

			if (texObj->getType() == Texture::TYPE_2D)
				RC_IF_ERROR(fboTexTarget != Framebuffer::TEXTARGET_2D, GL_INVALID_OPERATION, RC_RET_VOID);
			else
			{
				TCU_CHECK(texObj->getType() == Texture::TYPE_CUBE_MAP);
				if (!deInRange32(fboTexTarget, Framebuffer::TEXTARGET_CUBE_MAP_POSITIVE_X, Framebuffer::TEXTARGET_CUBE_MAP_NEGATIVE_Z))
					RC_ERROR_RET(GL_INVALID_OPERATION, RC_RET_VOID);
			}
		}

		Framebuffer::Attachment& fboAttachment = framebufferBinding->getAttachment(point);
		for (int ndx = 0; ndx < bindingRefCount; ndx++)
			releaseFboAttachmentReference(fboAttachment);
		fboAttachment = Framebuffer::Attachment();

		if (texObj)
		{
			fboAttachment.type			= Framebuffer::ATTACHMENTTYPE_TEXTURE;
			fboAttachment.name			= texObj->getName();
			fboAttachment.texTarget		= fboTexTarget;
			fboAttachment.level			= level;

			for (int ndx = 0; ndx < bindingRefCount; ndx++)
				acquireFboAttachmentReference(fboAttachment);
		}
	}
}